

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O1

bool __thiscall AABox::intersect(AABox *this,Ray *r)

{
  AABox *pAVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar5 = (r->dir).x;
  if (fVar5 <= 0.0) {
    fVar7 = (r->origin).x;
    fVar3 = this->x2 - fVar7;
    pAVar1 = this;
  }
  else {
    fVar7 = (r->origin).x;
    fVar3 = this->x1 - fVar7;
    pAVar1 = (AABox *)&this->x2;
  }
  fVar4 = (pAVar1->x1 - fVar7) / fVar5;
  fVar7 = (r->dir).y;
  fVar3 = fVar3 / fVar5;
  fVar5 = (r->origin).y;
  fVar2 = (r->origin).z;
  fVar6 = ((&this->y1)[fVar7 <= 0.0] - fVar5) / fVar7;
  fVar8 = fVar6;
  if (fVar6 <= fVar3) {
    fVar8 = fVar3;
  }
  fVar3 = (float)(~-(uint)NAN(fVar3) & (uint)fVar8 | -(uint)NAN(fVar3) & (uint)fVar6);
  fVar7 = ((&this->y1)[0.0 < fVar7] - fVar5) / fVar7;
  fVar5 = fVar7;
  if (fVar4 <= fVar7) {
    fVar5 = fVar4;
  }
  fVar7 = (float)(~-(uint)NAN(fVar4) & (uint)fVar5 | -(uint)NAN(fVar4) & (uint)fVar7);
  fVar5 = (r->dir).z;
  fVar4 = ((&this->z1)[fVar5 <= 0.0] - fVar2) / fVar5;
  fVar8 = fVar4;
  if (fVar4 <= fVar3) {
    fVar8 = fVar3;
  }
  fVar5 = ((&this->z1)[0.0 < fVar5] - fVar2) / fVar5;
  fVar2 = fVar5;
  if (fVar7 <= fVar5) {
    fVar2 = fVar7;
  }
  fVar5 = (float)(-(uint)NAN(fVar7) & (uint)fVar5 | ~-(uint)NAN(fVar7) & (uint)fVar2);
  return (bool)(-(0.0 < fVar5) &
                -((float)(-(uint)NAN(fVar3) & (uint)fVar4 | ~-(uint)NAN(fVar3) & (uint)fVar8) <=
                 fVar5) & 1);
}

Assistant:

bool intersect(const Ray& r)
	{
		float tmin, tmax;
		if (r.dir.x > 0)
			tmin = (x1 - r.origin.x) / r.dir.x,
			tmax = (x2 - r.origin.x) / r.dir.x;
		else
			tmin = (x2 - r.origin.x) / r.dir.x,
			tmax = (x1 - r.origin.x) / r.dir.x;
		if (r.dir.y > 0)
			tmin = fmax(tmin, (y1 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y2 - r.origin.y) / r.dir.y);
		else
			tmin = fmax(tmin, (y2 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y1 - r.origin.y) / r.dir.y);
		if (r.dir.z > 0)
			tmin = fmax(tmin, (z1 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z2 - r.origin.z) / r.dir.z);
		else
			tmin = fmax(tmin, (z2 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z1 - r.origin.z) / r.dir.z);
		return tmin <= tmax && tmax > 0;
	}